

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

parser_error parse_store(parser *p)

{
  store_conflict *v;
  byte bVar1;
  angband_constants *paVar2;
  store_conflict *psVar3;
  _Bool _Var4;
  wchar_t wVar5;
  uint uVar6;
  char *code;
  parser_error pVar7;
  
  code = parser_getstr(p,"feat");
  wVar5 = lookup_feat_code(code);
  pVar7 = PARSE_ERROR_INVALID_VALUE;
  if (L'\xffffffff' < wVar5) {
    _Var4 = flag_has_dbg(f_info[(uint)wVar5].flags,4,0x15,"f_info[feat].flags","TF_SHOP");
    psVar3 = stores;
    paVar2 = z_info;
    if (_Var4) {
      bVar1 = f_info[(uint)wVar5].shopnum;
      if ((bVar1 == 0) || (z_info->store_max < (ushort)bVar1)) {
        __assert_fail("f_info[feat].shopnum >= 1 && f_info[feat].shopnum <= z_info->store_max",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/store.c"
                      ,0x8d,"enum parser_error parse_store(struct parser *)");
      }
      uVar6 = bVar1 - 1;
      v = stores + uVar6;
      stores[uVar6].feat = wVar5;
      psVar3[uVar6].stock_size = paVar2->store_inven_max;
      parser_setpriv(p,v);
      pVar7 = PARSE_ERROR_NONE;
    }
  }
  return pVar7;
}

Assistant:

static enum parser_error parse_store(struct parser *p) {
	int feat = lookup_feat_code(parser_getstr(p, "feat"));
	struct store *s;

	if (feat < 0 || !tf_has(f_info[feat].flags, TF_SHOP)) {
		return PARSE_ERROR_INVALID_VALUE;
	}

	assert(f_info[feat].shopnum >= 1
		&& f_info[feat].shopnum <= z_info->store_max);
	s = &stores[f_info[feat].shopnum - 1];
	s->feat = feat;
	s->stock_size = z_info->store_inven_max;
	parser_setpriv(p, s);
	return PARSE_ERROR_NONE;
}